

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::InsertRect
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root,int a_level)

{
  double *pdVar1;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 a_node;
  bool bVar2;
  ON_RTreeNode *a_node_00;
  long lVar3;
  ON_RTreeNode *newNode;
  ON_RTreeNode *local_70;
  ON_RTreeBranch local_68;
  
  bVar2 = InsertRectRec(this,a_rect,a_id,*a_root,&local_70,a_level);
  if (bVar2) {
    a_node_00 = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
    a_node.m_child = *a_root;
    a_node_00->m_level = (a_node.m_child)->m_level + 1;
    NodeCover(&local_68.m_rect,a_node.m_child);
    lVar3 = (long)a_node_00->m_count;
    if (lVar3 < 6) {
      a_node_00->m_branch[lVar3].field_1.m_child = (ON_RTreeNode *)a_node;
      pdVar1 = a_node_00->m_branch[lVar3].m_rect.m_max + 1;
      *pdVar1 = local_68.m_rect.m_max[1];
      pdVar1[1] = local_68.m_rect.m_max[2];
      pdVar1 = a_node_00->m_branch[lVar3].m_rect.m_min + 2;
      *pdVar1 = local_68.m_rect.m_min[2];
      pdVar1[1] = local_68.m_rect.m_max[0];
      a_node_00->m_branch[lVar3].m_rect.m_min[0] = local_68.m_rect.m_min[0];
      a_node_00->m_branch[lVar3].m_rect.m_min[1] = local_68.m_rect.m_min[1];
      a_node_00->m_count = a_node_00->m_count + 1;
      local_68.field_1.m_child = a_node.m_child;
    }
    else {
      local_68.field_1.m_child = a_node.m_child;
      SplitNode(this,a_node_00,&local_68,(ON_RTreeNode **)0x0);
    }
    NodeCover(&local_68.m_rect,local_70);
    local_68.field_1.m_child = local_70;
    lVar3 = (long)a_node_00->m_count;
    if (lVar3 < 6) {
      a_node_00->m_branch[lVar3].field_1.m_child = local_70;
      pdVar1 = a_node_00->m_branch[lVar3].m_rect.m_max + 1;
      *pdVar1 = local_68.m_rect.m_max[1];
      pdVar1[1] = local_68.m_rect.m_max[2];
      pdVar1 = a_node_00->m_branch[lVar3].m_rect.m_min + 2;
      *pdVar1 = local_68.m_rect.m_min[2];
      pdVar1[1] = local_68.m_rect.m_max[0];
      a_node_00->m_branch[lVar3].m_rect.m_min[0] = local_68.m_rect.m_min[0];
      a_node_00->m_branch[lVar3].m_rect.m_min[1] = local_68.m_rect.m_min[1];
      a_node_00->m_count = a_node_00->m_count + 1;
    }
    else {
      SplitNode(this,a_node_00,&local_68,(ON_RTreeNode **)0x0);
    }
    *a_root = a_node_00;
  }
  return bVar2;
}

Assistant:

bool ON_RTree::InsertRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root, int a_level)
{
  ON_RTreeNode* newRoot;
  ON_RTreeNode* newNode;
  ON_RTreeBranch branch;

  if(InsertRectRec(a_rect, a_id, *a_root, &newNode, a_level))  // Root split
  {
    newRoot = m_mem_pool.AllocNode();  // Grow tree taller and new root
    newRoot->m_level = (*a_root)->m_level + 1;
    branch.m_rect = NodeCover(*a_root);
    branch.m_child = *a_root;
    AddBranch(&branch, newRoot, nullptr);
    branch.m_rect = NodeCover(newNode);
    branch.m_child = newNode;
    AddBranch(&branch, newRoot, nullptr);
    *a_root = newRoot;
    return true;
  }

  return false;
}